

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

void * MpiReadRemoteMemory(CP_Services Svcs,DP_RS_Stream Stream_v,int Rank,size_t TimeStep,
                          size_t Offset,size_t Length,void *Buffer,void *DP_TimeStepInfo)

{
  undefined8 in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  _MpiReadRequestMsg ReadRequestMsg;
  MpiWriterContactInfo TargetContact;
  MpiCompletionHandle ret;
  CManager cm;
  MpiStreamRD Stream;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 *local_68;
  undefined8 local_60;
  long local_58;
  void *local_50;
  undefined8 local_48;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  int local_1c;
  undefined8 *local_10;
  
  local_40 = in_RSI;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_10 = in_RDI;
  local_48 = (*(code *)in_RDI[1])(*in_RSI);
  local_50 = calloc(0x50,1);
  local_58 = local_40[0x10] + (long)local_1c * 0x50;
  (*(code *)*local_10)
            (*local_40,5,
             "Reader (rank %d) requesting to read remote memory for TimeStep %d from Rank %d, StreamWPR =%p, Offset=%d, Length=%d\n"
             ,*(undefined4 *)(local_40 + 1),local_28,local_1c,*(undefined8 *)(local_58 + 0x40),
             local_30,local_38);
  local_88 = CMCondition_get(local_48,0);
  local_84 = *(undefined4 *)(local_40 + 1);
  local_80 = local_28;
  local_78 = local_38;
  local_70 = local_30;
  local_68 = local_40;
  local_60 = *(undefined8 *)(local_58 + 0x40);
  memcpy(local_50,&local_88,0x30);
  *(undefined8 *)((long)local_50 + 0x40) = in_stack_00000008;
  *(undefined8 *)((long)local_50 + 0x30) = local_48;
  *(undefined8 *)((long)local_50 + 0x38) = *local_40;
  *(int *)((long)local_50 + 0x48) = local_1c;
  *(uint *)((long)local_50 + 0x4c) = (uint)(*(long *)(local_58 + 0x48) == local_40[2]);
  if (*(int *)((long)local_50 + 0x4c) == 0) {
    CMCondition_set_client_data(local_48,local_88,local_50);
    (*(code *)local_10[2])(*local_40,local_40[4],local_1c,local_40[6],&local_88);
    (*(code *)*local_10)
              (*local_40,5,"ReadRemoteMemory: Send to server, Link.CohortSize=%d\n",
               *(undefined4 *)(local_40 + 3));
  }
  return local_50;
}

Assistant:

static void *MpiReadRemoteMemory(CP_Services Svcs, DP_RS_Stream Stream_v, int Rank, size_t TimeStep,
                                 size_t Offset, size_t Length, void *Buffer, void *DP_TimeStepInfo)
{
    /* DP_RS_Stream is the return from InitReader */
    MpiStreamRD Stream = (MpiStreamRD)Stream_v;
    CManager cm = Svcs->getCManager(Stream->Stream.CP_Stream);
    MpiCompletionHandle ret = calloc(sizeof(struct _MpiCompletionHandle), 1);

    MpiWriterContactInfo TargetContact = &Stream->CohortWriterInfo[Rank];

    Svcs->verbose(Stream->Stream.CP_Stream, DPTraceVerbose,
                  "Reader (rank %d) requesting to read remote memory for TimeStep %d "
                  "from Rank %d, StreamWPR =%p, Offset=%d, Length=%d\n",
                  Stream->Stream.Rank, TimeStep, Rank, TargetContact->StreamWPR, Offset, Length);

    /* send request to appropriate writer */
    struct _MpiReadRequestMsg ReadRequestMsg = {.Length = Length,
                                                .NotifyCondition = CMCondition_get(cm, NULL),
                                                .Offset = Offset,
                                                .RequestingRank = Stream->Stream.Rank,
                                                .StreamRS = Stream,
                                                .StreamWPR = TargetContact->StreamWPR,
                                                .TimeStep = TimeStep};

    ret->ReadRequest = ReadRequestMsg;
    ret->Buffer = Buffer;
    ret->cm = cm;
    ret->CPStream = Stream->Stream.CP_Stream;
    ret->DestinationRank = Rank;
    ret->CommType = (TargetContact->taskID == Stream->Stream.taskID) ? MPI_DP_LOCAL : MPI_DP_REMOTE;

    if (ret->CommType == MPI_DP_REMOTE)
    {
        CMCondition_set_client_data(cm, ReadRequestMsg.NotifyCondition, ret);
        Svcs->sendToPeer(Stream->Stream.CP_Stream, Stream->Link.PeerCohort, Rank,
                         Stream->ReadRequestFormat, &ReadRequestMsg);

        Svcs->verbose(Stream->Stream.CP_Stream, DPTraceVerbose,
                      "ReadRemoteMemory: Send to server, Link.CohortSize=%d\n",
                      Stream->Link.CohortSize);
    }

    return ret;
}